

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_script.cpp
# Opt level: O0

ScriptDataResponseStruct *
cfd::js::api::ScriptStructApi::CreateMultisigScriptSig
          (ScriptDataResponseStruct *__return_storage_ptr__,
          CreateMultisigScriptSigRequestStruct *request)

{
  CreateMultisigScriptSigRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateMultisigScriptSigRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  CreateMultisigScriptSigRequestStruct *pCStack_18;
  anon_class_1_0_00000001 call_func;
  CreateMultisigScriptSigRequestStruct *request_local;
  ScriptDataResponseStruct *result;
  
  local_1a = 0;
  pCStack_18 = request;
  ScriptDataResponseStruct::ScriptDataResponseStruct(__return_storage_ptr__);
  this = pCStack_18;
  std::
  function<cfd::js::api::ScriptDataResponseStruct(cfd::js::api::CreateMultisigScriptSigRequestStruct_const&)>
  ::
  function<cfd::js::api::ScriptStructApi::CreateMultisigScriptSig(cfd::js::api::CreateMultisigScriptSigRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::ScriptDataResponseStruct(cfd::js::api::CreateMultisigScriptSigRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"CreateMultisigScriptSig",&local_129);
  ExecuteStructApi<cfd::js::api::CreateMultisigScriptSigRequestStruct,cfd::js::api::ScriptDataResponseStruct>
            ((ScriptDataResponseStruct *)(local_108 + 0x20),(api *)this,
             (CreateMultisigScriptSigRequestStruct *)local_108,&local_128,in_R8);
  ScriptDataResponseStruct::operator=
            (__return_storage_ptr__,(ScriptDataResponseStruct *)(local_108 + 0x20));
  ScriptDataResponseStruct::~ScriptDataResponseStruct
            ((ScriptDataResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateMultisigScriptSigRequestStruct_&)>
  ::~function((function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateMultisigScriptSigRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

ScriptDataResponseStruct ScriptStructApi::CreateMultisigScriptSig(
    const CreateMultisigScriptSigRequestStruct& request) {
  auto call_func = [](const CreateMultisigScriptSigRequestStruct& request)
      -> ScriptDataResponseStruct {
    ScriptDataResponseStruct response;

    if (request.sign_params.size() == 0) {
      warn(CFD_LOG_SOURCE, "empty sign params.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to CreateMultisigScriptSig. empty sign params.");
    }

    Script redeem_script(request.redeem_script);
    std::vector<SignParameter> sign_list;

    SignParameter sign_data;
    for (const auto& stack_req : request.sign_params) {
      sign_data =
          TransactionStructApiBase::ConvertSignDataStructToSignParameter(
              stack_req);
      if (!stack_req.related_pubkey.empty()) {
        sign_data.SetRelatedPubkey(Pubkey(stack_req.related_pubkey));
      }
      sign_list.push_back(sign_data);
    }

    TransactionApi api;
    response.hex = api.CreateMultisigScriptSig(sign_list, redeem_script);
    return response;
  };

  ScriptDataResponseStruct result;
  result = ExecuteStructApi<
      CreateMultisigScriptSigRequestStruct, ScriptDataResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}